

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testwidgets.cpp
# Opt level: O0

void do_pop_up_choice_proc(Am_Object *param_1)

{
  undefined8 uVar1;
  Am_Value_List *pAVar2;
  ostream *poVar3;
  Am_Value_List local_40 [16];
  Am_Value_List local_30 [16];
  undefined1 local_20 [8];
  Am_Value v;
  Am_Object *param_0_local;
  
  v.value = (anon_union_8_8_ea4c8939_for_value)param_1;
  Am_Value_List::Am_Value_List(local_40);
  uVar1 = Am_Value_List::Add(local_40,"First line of choice",1);
  pAVar2 = (Am_Value_List *)Am_Value_List::Add(uVar1,"Second Line of Choice",1);
  Am_Value_List::Am_Value_List(local_30,pAVar2);
  Am_Get_Choice_From_Dialog(local_20,local_30,0xffffd8f0,0xffffd8f0,1);
  Am_Value_List::~Am_Value_List(local_30);
  Am_Value_List::~Am_Value_List(local_40);
  poVar3 = std::operator<<((ostream *)&std::cout,"Value returned is `");
  poVar3 = (ostream *)operator<<(poVar3,(Am_Value *)local_20);
  poVar3 = std::operator<<(poVar3,"\'\n");
  std::ostream::operator<<(poVar3,std::flush<char,std::char_traits<char>>);
  Am_Value::~Am_Value((Am_Value *)local_20);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, do_pop_up_choice, (Am_Object /*cmd*/))
{
  Am_Value v = Am_Get_Choice_From_Dialog(
      Am_Value_List().Add("First line of choice").Add("Second Line of Choice"));
  std::cout << "Value returned is `" << v << "'\n" << std::flush;
}